

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DecorationManager::AreDecorationsTheSame
          (DecorationManager *this,Instruction *inst1,Instruction *inst2,bool ignore_target)

{
  bool bVar1;
  Op OVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Operand *o1;
  Operand *o2;
  uint local_30;
  uint32_t i;
  bool ignore_target_local;
  Instruction *inst2_local;
  Instruction *inst1_local;
  DecorationManager *this_local;
  
  OVar2 = opt::Instruction::opcode(inst1);
  if (((OVar2 - OpDecorate < 2) || (OVar2 == OpDecorateId)) || (OVar2 == OpDecorateString)) {
    OVar2 = opt::Instruction::opcode(inst1);
    OVar3 = opt::Instruction::opcode(inst2);
    if (OVar2 == OVar3) {
      uVar4 = opt::Instruction::NumInOperands(inst1);
      uVar5 = opt::Instruction::NumInOperands(inst2);
      if (uVar4 == uVar5) {
        local_30 = (uint)ignore_target;
        while( true ) {
          uVar4 = opt::Instruction::NumInOperands(inst1);
          if (uVar4 <= local_30) {
            return true;
          }
          o1 = opt::Instruction::GetInOperand(inst1,local_30);
          o2 = opt::Instruction::GetInOperand(inst2,local_30);
          bVar1 = opt::operator!=(o1,o2);
          if (bVar1) break;
          local_30 = local_30 + 1;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool DecorationManager::AreDecorationsTheSame(const Instruction* inst1,
                                              const Instruction* inst2,
                                              bool ignore_target) const {
  switch (inst1->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
      break;
    default:
      return false;
  }

  if (inst1->opcode() != inst2->opcode() ||
      inst1->NumInOperands() != inst2->NumInOperands())
    return false;

  for (uint32_t i = ignore_target ? 1u : 0u; i < inst1->NumInOperands(); ++i)
    if (inst1->GetInOperand(i) != inst2->GetInOperand(i)) return false;

  return true;
}